

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O2

void __thiscall duckdb::SelectNode::Serialize(SelectNode *this,Serializer *serializer)

{
  QueryNode::Serialize(&this->super_QueryNode,serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,200,"select_list",&this->select_list);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (serializer,0xc9,"from_table",&this->from_table);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xca,"where_clause",&this->where_clause);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xcb,"group_expressions",&(this->groups).group_expressions);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,true>>
            (serializer,0xcc,"group_sets",&(this->groups).grouping_sets);
  Serializer::WriteProperty<duckdb::AggregateHandling>
            (serializer,0xcd,"aggregate_handling",&this->aggregate_handling);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xce,"having",&this->having);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            (serializer,0xcf,"sample",&this->sample);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xd0,"qualify",&this->qualify);
  return;
}

Assistant:

void SelectNode::Serialize(Serializer &serializer) const {
	QueryNode::Serialize(serializer);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(200, "select_list", select_list);
	serializer.WritePropertyWithDefault<unique_ptr<TableRef>>(201, "from_table", from_table);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(202, "where_clause", where_clause);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(203, "group_expressions", groups.group_expressions);
	serializer.WritePropertyWithDefault<vector<GroupingSet>>(204, "group_sets", groups.grouping_sets);
	serializer.WriteProperty<AggregateHandling>(205, "aggregate_handling", aggregate_handling);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(206, "having", having);
	serializer.WritePropertyWithDefault<unique_ptr<SampleOptions>>(207, "sample", sample);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(208, "qualify", qualify);
}